

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68010_move_fr_ccr(m68k_info *info)

{
  if ((info->type & 0x1e) != 0) {
    MCInst_setOpcode(info->inst,0x119);
    (info->extension).op_count = '\x02';
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x2;
    (info->extension).operands[0].address_mode = M68K_AM_NONE;
    (info->extension).operands[0].field_0.simm = 3.78351e-44;
    get_ea_mode_op(info,(info->extension).operands + 1,info->ir,1);
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68010_move_fr_ccr(m68k_info *info)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext;

	LIMIT_CPU_TYPES(info, M68010_PLUS);

	ext = build_init_op(info, M68K_INS_MOVE, 2, 2);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->address_mode = M68K_AM_NONE;
	op0->reg = M68K_REG_CCR;

	get_ea_mode_op(info, op1, info->ir, 1);
}